

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

bool doctest::anon_unknown_14::parseOptionImpl(int argc,char **argv,char *pattern,String *value)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  char *__s;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  ulong uVar7;
  anon_union_24_2_13149d16_for_String_2 local_48;
  
  if (0 < argc) {
    uVar7 = (ulong)(uint)argc;
    do {
      pcVar2 = argv[uVar7 - 1];
      __s = strstr(pcVar2,pattern);
      if (__s != (char *)0x0) {
        pcVar6 = pcVar2;
        if (value == (String *)0x0) {
          sVar4 = strlen(__s);
          sVar5 = strlen(pattern);
          if (sVar4 != sVar5) goto LAB_00116f00;
        }
        do {
          if (pcVar6 == __s) {
            if (*pcVar2 == '-') {
              if (value == (String *)0x0) {
                return true;
              }
              sVar4 = strlen(pattern);
              sVar5 = strlen(__s + sVar4);
              if ((int)sVar5 != 0) {
                String::String((String *)&local_48.data,__s + sVar4);
                if (&local_48 != &value->field_0) {
                  if (((value->field_0).buf[0x17] < '\0') &&
                     (pcVar2 = (value->field_0).data.ptr, pcVar2 != (char *)0x0)) {
                    operator_delete__(pcVar2);
                  }
                  *(ulong *)((long)&value->field_0 + 0x10) =
                       CONCAT17(local_48.buf[0x17],local_48._16_7_);
                  (value->field_0).data.ptr = (char *)CONCAT71(local_48._1_7_,local_48.buf[0]);
                  *(undefined8 *)((long)&value->field_0 + 8) = local_48._8_8_;
                  local_48.buf[0] = '\0';
                  local_48.buf[0x17] = '\x17';
                }
                String::~String((String *)&local_48.data);
                return true;
              }
            }
            break;
          }
          cVar1 = *pcVar6;
          pcVar6 = pcVar6 + 1;
        } while (cVar1 == '-');
      }
LAB_00116f00:
      bVar3 = 1 < (long)uVar7;
      uVar7 = uVar7 - 1;
    } while (bVar3);
  }
  return false;
}

Assistant:

bool parseOptionImpl(int argc, const char* const* argv, const char* pattern, String* value) {
        // going from the end to the beginning and stopping on the first occurrence from the end
        for(int i = argc; i > 0; --i) {
            auto index = i - 1;
            auto temp = std::strstr(argv[index], pattern);
            if(temp && (value || strlen(temp) == strlen(pattern))) { //!OCLINT prefer early exits and continue
                // eliminate matches in which the chars before the option are not '-'
                bool noBadCharsFound = true;
                auto curr            = argv[index];
                while(curr != temp) {
                    if(*curr++ != '-') {
                        noBadCharsFound = false;
                        break;
                    }
                }
                if(noBadCharsFound && argv[index][0] == '-') {
                    if(value) {
                        // parsing the value of an option
                        temp += strlen(pattern);
                        const unsigned len = strlen(temp);
                        if(len) {
                            *value = temp;
                            return true;
                        }
                    } else {
                        // just a flag - no value
                        return true;
                    }
                }
            }
        }
        return false;
    }